

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O0

void __thiscall ExecutorRegVm::Resume(ExecutorRegVm *this)

{
  ExecutorRegVm *this_local;
  
  FastVector<RegVmCmd_*,_false,_false>::shrink(&this->callStack,this->execErrorFinalReturnDepth);
  this->codeRunning = true;
  this->callContinue = true;
  this->execErrorMessage = (char *)0x0;
  (this->execErrorObject).typeID = 0;
  (this->execErrorObject).ptr = (char *)0x0;
  return;
}

Assistant:

void ExecutorRegVm::Resume()
{
	callStack.shrink(execErrorFinalReturnDepth);

	codeRunning = true;

	callContinue = true;

	execErrorMessage = NULL;

	execErrorObject.typeID = 0;
	execErrorObject.ptr = NULL;
}